

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeImportInfo
          (cmGeneratorTarget *this,string *desired_config,ImportInfo *info)

{
  bool bVar1;
  char *pcVar2;
  string linkProp;
  string suffix;
  char *imp;
  char *loc;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  char *local_28;
  char *local_20;
  
  info->NoSOName = false;
  local_20 = (char *)0x0;
  local_28 = (char *)0x0;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  bVar1 = cmTarget::GetMappedConfig(this->Target,desired_config,&local_20,&local_28,&local_48);
  if (!bVar1) goto LAB_004228e6;
  std::__cxx11::string::string
            ((string *)&local_88,"INTERFACE_LINK_LIBRARIES",(allocator *)&local_68);
  pcVar2 = GetProperty(this,&local_88);
  if (this->Target->TargetTypeValue == INTERFACE_LIBRARY) {
LAB_004223c4:
    if (pcVar2 != (char *)0x0) goto LAB_00422409;
  }
  else {
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::assign((char *)&local_88);
      std::__cxx11::string::append((string *)&local_88);
      pcVar2 = GetProperty(this,&local_88);
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::string::assign((char *)&local_88);
        pcVar2 = GetProperty(this,&local_88);
        goto LAB_004223c4;
      }
    }
LAB_00422409:
    std::__cxx11::string::_M_assign((string *)&info->LibrariesProp);
    std::__cxx11::string::assign((char *)&info->Libraries);
  }
  std::__cxx11::string::~string((string *)&local_88);
  if (this->Target->TargetTypeValue == INTERFACE_LIBRARY) goto LAB_004228e6;
  if (local_20 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_88,"IMPORTED_LOCATION",(allocator *)&local_68);
    std::__cxx11::string::append((string *)&local_88);
    pcVar2 = GetProperty(this,&local_88);
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_68,"IMPORTED_LOCATION",&local_89);
      pcVar2 = GetProperty(this,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::assign((char *)&info->Location);
      }
    }
    else {
      std::__cxx11::string::assign((char *)&info->Location);
    }
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    std::__cxx11::string::assign((char *)&info->Location);
  }
  if (this->Target->TargetTypeValue == SHARED_LIBRARY) {
    std::__cxx11::string::string((string *)&local_88,"IMPORTED_SONAME",(allocator *)&local_68);
    std::__cxx11::string::append((string *)&local_88);
    pcVar2 = GetProperty(this,&local_88);
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_68,"IMPORTED_SONAME",&local_89);
      pcVar2 = GetProperty(this,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::assign((char *)&info->SOName);
      }
    }
    else {
      std::__cxx11::string::assign((char *)&info->SOName);
    }
    std::__cxx11::string::~string((string *)&local_88);
    if (this->Target->TargetTypeValue == SHARED_LIBRARY) {
      std::__cxx11::string::string((string *)&local_88,"IMPORTED_NO_SONAME",(allocator *)&local_68);
      std::__cxx11::string::append((string *)&local_88);
      pcVar2 = GetProperty(this,&local_88);
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_68,"IMPORTED_NO_SONAME",&local_89);
        pcVar2 = GetProperty(this,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        if (pcVar2 != (char *)0x0) {
          bVar1 = cmSystemTools::IsOn(pcVar2);
          goto LAB_0042263f;
        }
      }
      else {
        bVar1 = cmSystemTools::IsOn(pcVar2);
LAB_0042263f:
        info->NoSOName = bVar1;
      }
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  if (local_28 == (char *)0x0) {
    if ((this->Target->TargetTypeValue == SHARED_LIBRARY) ||
       (bVar1 = IsExecutableWithExports(this), bVar1)) {
      std::__cxx11::string::string((string *)&local_88,"IMPORTED_IMPLIB",(allocator *)&local_68);
      std::__cxx11::string::append((string *)&local_88);
      pcVar2 = GetProperty(this,&local_88);
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_68,"IMPORTED_IMPLIB",&local_89);
        pcVar2 = GetProperty(this,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        if (pcVar2 != (char *)0x0) {
          std::__cxx11::string::assign((char *)&info->ImportLibrary);
        }
      }
      else {
        std::__cxx11::string::assign((char *)&info->ImportLibrary);
      }
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  else {
    std::__cxx11::string::assign((char *)&info->ImportLibrary);
  }
  std::__cxx11::string::string
            ((string *)&local_88,"IMPORTED_LINK_DEPENDENT_LIBRARIES",(allocator *)&local_68);
  std::__cxx11::string::append((string *)&local_88);
  pcVar2 = GetProperty(this,&local_88);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_68,"IMPORTED_LINK_DEPENDENT_LIBRARIES",&local_89);
    pcVar2 = GetProperty(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&info->SharedDeps);
    }
  }
  else {
    std::__cxx11::string::assign((char *)&info->SharedDeps);
  }
  std::__cxx11::string::~string((string *)&local_88);
  if (this->Target->TargetTypeValue != STATIC_LIBRARY) goto LAB_004228e6;
  std::__cxx11::string::string
            ((string *)&local_88,"IMPORTED_LINK_INTERFACE_LANGUAGES",(allocator *)&local_68);
  std::__cxx11::string::append((string *)&local_88);
  pcVar2 = GetProperty(this,&local_88);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_68,"IMPORTED_LINK_INTERFACE_LANGUAGES",&local_89);
    pcVar2 = GetProperty(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&info->Languages);
    }
  }
  else {
    std::__cxx11::string::assign((char *)&info->Languages);
  }
  std::__cxx11::string::~string((string *)&local_88);
  if (this->Target->TargetTypeValue != STATIC_LIBRARY) goto LAB_004228e6;
  std::__cxx11::string::string
            ((string *)&local_88,"IMPORTED_LINK_INTERFACE_MULTIPLICITY",(allocator *)&local_68);
  std::__cxx11::string::append((string *)&local_88);
  pcVar2 = GetProperty(this,&local_88);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_68,"IMPORTED_LINK_INTERFACE_MULTIPLICITY",&local_89);
    pcVar2 = GetProperty(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (pcVar2 != (char *)0x0) goto LAB_004228c4;
  }
  else {
LAB_004228c4:
    __isoc99_sscanf(pcVar2,"%u",&info->Multiplicity);
  }
  std::__cxx11::string::~string((string *)&local_88);
LAB_004228e6:
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeImportInfo(std::string const& desired_config,
                                 ImportInfo& info) const
{
  // This method finds information about an imported target from its
  // properties.  The "IMPORTED_" namespace is reserved for properties
  // defined by the project exporting the target.

  // Initialize members.
  info.NoSOName = false;

  const char* loc = 0;
  const char* imp = 0;
  std::string suffix;
  if (!this->Target->GetMappedConfig(desired_config, &loc, &imp, suffix))
    {
    return;
    }

  // Get the link interface.
  {
  std::string linkProp = "INTERFACE_LINK_LIBRARIES";
  const char *propertyLibs = this->GetProperty(linkProp);

  if (this->GetType() != cmState::INTERFACE_LIBRARY)
    {
    if(!propertyLibs)
      {
      linkProp = "IMPORTED_LINK_INTERFACE_LIBRARIES";
      linkProp += suffix;
      propertyLibs = this->GetProperty(linkProp);
      }

    if(!propertyLibs)
      {
      linkProp = "IMPORTED_LINK_INTERFACE_LIBRARIES";
      propertyLibs = this->GetProperty(linkProp);
      }
    }
  if(propertyLibs)
    {
    info.LibrariesProp = linkProp;
    info.Libraries = propertyLibs;
    }
  }
  if(this->GetType() == cmState::INTERFACE_LIBRARY)
    {
    return;
    }

  // A provided configuration has been chosen.  Load the
  // configuration's properties.

  // Get the location.
  if(loc)
    {
    info.Location = loc;
    }
  else
    {
    std::string impProp = "IMPORTED_LOCATION";
    impProp += suffix;
    if(const char* config_location = this->GetProperty(impProp))
      {
      info.Location = config_location;
      }
    else if(const char* location = this->GetProperty("IMPORTED_LOCATION"))
      {
      info.Location = location;
      }
    }

  // Get the soname.
  if(this->GetType() == cmState::SHARED_LIBRARY)
    {
    std::string soProp = "IMPORTED_SONAME";
    soProp += suffix;
    if(const char* config_soname = this->GetProperty(soProp))
      {
      info.SOName = config_soname;
      }
    else if(const char* soname = this->GetProperty("IMPORTED_SONAME"))
      {
      info.SOName = soname;
      }
    }

  // Get the "no-soname" mark.
  if(this->GetType() == cmState::SHARED_LIBRARY)
    {
    std::string soProp = "IMPORTED_NO_SONAME";
    soProp += suffix;
    if(const char* config_no_soname = this->GetProperty(soProp))
      {
      info.NoSOName = cmSystemTools::IsOn(config_no_soname);
      }
    else if(const char* no_soname = this->GetProperty("IMPORTED_NO_SONAME"))
      {
      info.NoSOName = cmSystemTools::IsOn(no_soname);
      }
    }

  // Get the import library.
  if(imp)
    {
    info.ImportLibrary = imp;
    }
  else if(this->GetType() == cmState::SHARED_LIBRARY ||
          this->IsExecutableWithExports())
    {
    std::string impProp = "IMPORTED_IMPLIB";
    impProp += suffix;
    if(const char* config_implib = this->GetProperty(impProp))
      {
      info.ImportLibrary = config_implib;
      }
    else if(const char* implib = this->GetProperty("IMPORTED_IMPLIB"))
      {
      info.ImportLibrary = implib;
      }
    }

  // Get the link dependencies.
  {
  std::string linkProp = "IMPORTED_LINK_DEPENDENT_LIBRARIES";
  linkProp += suffix;
  if(const char* config_libs = this->GetProperty(linkProp))
    {
    info.SharedDeps = config_libs;
    }
  else if(const char* libs =
          this->GetProperty("IMPORTED_LINK_DEPENDENT_LIBRARIES"))
    {
    info.SharedDeps = libs;
    }
  }

  // Get the link languages.
  if(this->LinkLanguagePropagatesToDependents())
    {
    std::string linkProp = "IMPORTED_LINK_INTERFACE_LANGUAGES";
    linkProp += suffix;
    if(const char* config_libs = this->GetProperty(linkProp))
      {
      info.Languages = config_libs;
      }
    else if(const char* libs =
            this->GetProperty("IMPORTED_LINK_INTERFACE_LANGUAGES"))
      {
      info.Languages = libs;
      }
    }

  // Get the cyclic repetition count.
  if(this->GetType() == cmState::STATIC_LIBRARY)
    {
    std::string linkProp = "IMPORTED_LINK_INTERFACE_MULTIPLICITY";
    linkProp += suffix;
    if(const char* config_reps = this->GetProperty(linkProp))
      {
      sscanf(config_reps, "%u", &info.Multiplicity);
      }
    else if(const char* reps =
            this->GetProperty("IMPORTED_LINK_INTERFACE_MULTIPLICITY"))
      {
      sscanf(reps, "%u", &info.Multiplicity);
      }
    }
}